

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O2

void CRenderTools::RenderEvalEnvelope
               (CEnvPoint *pPoints,int NumPoints,int Channels,float Time,float *pResult)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  CEnvPoint *pCVar5;
  float fVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  float fVar12;
  int iVar13;
  float fVar14;
  int iVar15;
  undefined1 in_XMM1 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float p3;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  CEnvPoint *pCVar6;
  
  if (NumPoints == 1) {
    iVar8 = (pPoints->super_CEnvPoint_v1).m_aValues[0];
    iVar11 = (pPoints->super_CEnvPoint_v1).m_aValues[1];
    iVar13 = (pPoints->super_CEnvPoint_v1).m_aValues[2];
    iVar15 = (pPoints->super_CEnvPoint_v1).m_aValues[3];
  }
  else {
    if (NumPoints == 0) {
      fVar7 = 0.0;
      fVar10 = 0.0;
      fVar12 = 0.0;
      fVar14 = 0.0;
      goto LAB_0017d187;
    }
    uVar4 = NumPoints - 1;
    auVar16._4_12_ = in_XMM1._4_12_;
    auVar16._0_4_ = (float)pPoints[(int)uVar4].super_CEnvPoint_v1.m_Time / 1000.0;
    fVar7 = (float)FUN_00113d40(Time,auVar16._0_8_);
    fVar7 = fVar7 * 1000.0;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    pCVar5 = pPoints;
    for (; pCVar6 = pCVar5 + 1, uVar3 * 0x58 + uVar2 != 0; uVar2 = uVar2 - 0x58) {
      iVar8 = (pCVar5->super_CEnvPoint_v1).m_Time;
      fVar10 = (float)iVar8;
      if ((fVar10 <= fVar7) &&
         (iVar11 = (pCVar6->super_CEnvPoint_v1).m_Time, fVar7 <= (float)iVar11)) {
        fVar10 = (fVar7 - fVar10) / (float)(iVar11 - iVar8);
        switch((pCVar5->super_CEnvPoint_v1).m_Curvetype) {
        case 0:
          fVar10 = 0.0;
          break;
        case 2:
          fVar10 = fVar10 * fVar10 * fVar10;
          break;
        case 3:
          fVar10 = 1.0 - fVar10;
          fVar10 = 1.0 - fVar10 * fVar10 * fVar10;
          break;
        case 4:
          fVar10 = fVar10 * -2.0 * fVar10 * fVar10 + fVar10 * 3.0 * fVar10;
          break;
        case 5:
          piVar1 = (int *)((long)pPoints + (0x80 - uVar2));
          uVar2 = 0;
          uVar3 = (ulong)(uint)Channels;
          if (Channels < 1) {
            uVar3 = uVar2;
          }
          for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
            auVar19._0_4_ = (float)(pCVar5->super_CEnvPoint_v1).m_Time;
            auVar19._4_4_ = (float)piVar1[-0x12];
            auVar19._8_8_ = 0;
            auVar16 = divps(auVar19,_DAT_001cd740);
            iVar8 = piVar1[-0xe];
            iVar11 = piVar1[-0x1e];
            auVar18._0_4_ = (float)(pCVar6->super_CEnvPoint_v1).m_Time;
            auVar18._4_4_ = (float)piVar1[-4];
            auVar18._8_8_ = 0;
            auVar19 = divps(auVar18,_DAT_001cd740);
            iVar13 = *piVar1;
            iVar15 = piVar1[-8];
            fVar12 = auVar16._0_4_;
            fVar14 = auVar16._4_4_ + fVar12;
            p3 = auVar19._0_4_;
            fVar17 = auVar19._4_4_ + p3;
            fVar10 = p3;
            if (fVar14 <= p3) {
              fVar10 = fVar14;
            }
            fVar9 = p3;
            if (fVar17 <= p3) {
              fVar9 = fVar17;
            }
            fVar12 = SolveBezier(fVar7 / 1000.0,fVar12,
                                 (float)(-(uint)(fVar14 < fVar12) & (uint)fVar12 |
                                        ~-(uint)(fVar14 < fVar12) & (uint)fVar10),
                                 (float)(-(uint)(fVar17 < fVar12) & (uint)fVar12 |
                                        ~-(uint)(fVar17 < fVar12) & (uint)fVar9),p3);
            fVar10 = 1.0;
            if (fVar12 <= 1.0) {
              fVar10 = fVar12;
            }
            fVar10 = bezier<float,float>((float)iVar11 * 0.0009765625,
                                         (float)iVar8 * 0.0009765625 + (float)iVar11 * 0.0009765625,
                                         (float)iVar13 * 0.0009765625 + (float)iVar15 * 0.0009765625
                                         ,(float)iVar15 * 0.0009765625,
                                         (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar10));
            pResult[uVar2] = fVar10;
            piVar1 = piVar1 + 1;
          }
          return;
        }
        piVar1 = (int *)((long)pPoints + (0x60 - uVar2));
        uVar2 = 0;
        uVar3 = (ulong)(uint)Channels;
        if (Channels < 1) {
          uVar3 = uVar2;
        }
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          pResult[uVar2] =
               ((float)*piVar1 * 0.0009765625 - (float)piVar1[-0x16] * 0.0009765625) * fVar10 +
               (float)piVar1[-0x16] * 0.0009765625;
          piVar1 = piVar1 + 1;
        }
        return;
      }
      pCVar5 = pCVar6;
    }
    iVar8 = pPoints[(int)uVar4].super_CEnvPoint_v1.m_aValues[0];
    iVar11 = pPoints[(int)uVar4].super_CEnvPoint_v1.m_aValues[1];
    iVar13 = pPoints[(int)uVar4].super_CEnvPoint_v1.m_aValues[2];
    iVar15 = pPoints[(int)uVar4].super_CEnvPoint_v1.m_aValues[3];
  }
  fVar7 = (float)iVar8 * 0.0009765625;
  fVar10 = (float)iVar11 * 0.0009765625;
  fVar12 = (float)iVar13 * 0.0009765625;
  fVar14 = (float)iVar15 * 0.0009765625;
LAB_0017d187:
  *pResult = fVar7;
  pResult[1] = fVar10;
  pResult[2] = fVar12;
  pResult[3] = fVar14;
  return;
}

Assistant:

void CRenderTools::RenderEvalEnvelope(const CEnvPoint *pPoints, int NumPoints, int Channels, float Time, float *pResult)
{
	if(NumPoints == 0)
	{
		pResult[0] = 0;
		pResult[1] = 0;
		pResult[2] = 0;
		pResult[3] = 0;
		return;
	}

	if(NumPoints == 1)
	{
		pResult[0] = fx2f(pPoints[0].m_aValues[0]);
		pResult[1] = fx2f(pPoints[0].m_aValues[1]);
		pResult[2] = fx2f(pPoints[0].m_aValues[2]);
		pResult[3] = fx2f(pPoints[0].m_aValues[3]);
		return;
	}

	Time = fmod(Time, pPoints[NumPoints-1].m_Time/1000.0f)*1000.0f;

	for(int i = 0; i < NumPoints-1; i++)
	{
		if(Time >= pPoints[i].m_Time && Time <= pPoints[i+1].m_Time)
		{
			float Delta = pPoints[i+1].m_Time-pPoints[i].m_Time;
			float a = (Time-pPoints[i].m_Time)/Delta;

			switch(pPoints[i].m_Curvetype)
			{
			case CURVETYPE_STEP:
				a = 0;
				break;
			case CURVETYPE_SMOOTH:
				a = -2*a*a*a + 3*a*a; // second hermite basis
				break;
			case CURVETYPE_SLOW:
				a = a*a*a;
				break;
			case CURVETYPE_FAST:
				a = 1-a;
				a = 1-a*a*a;
				break;
			case CURVETYPE_BEZIER:
				for(int c = 0; c < Channels; c++)
				{
					// monotonic 2d cubic bezier curve
					vec2 p0, p1, p2, p3;
					vec2 inTang, outTang;

					p0 = vec2(pPoints[i].m_Time/1000.0f, fx2f(pPoints[i].m_aValues[c]));
					p3 = vec2(pPoints[i+1].m_Time/1000.0f, fx2f(pPoints[i+1].m_aValues[c]));

					outTang = vec2(pPoints[i].m_aOutTangentdx[c]/1000.0f, fx2f(pPoints[i].m_aOutTangentdy[c]));
					inTang = -vec2(pPoints[i+1].m_aInTangentdx[c]/1000.0f, fx2f(pPoints[i+1].m_aInTangentdy[c]));
					p1 = p0 + outTang;
					p2 = p3 - inTang;

					// validate bezier curve
					ValidateFCurve(p0, p1, p2, p3);

					// solve x(a) = time for a
					a = clamp(SolveBezier(Time/1000.0f, p0.x, p1.x, p2.x, p3.x), 0.0f, 1.0f);

					// value = y(t)
					pResult[c] =  bezier(p0.y, p1.y, p2.y, p3.y, a);
				}
				return;
			case CURVETYPE_LINEAR:
				break;
			}

			for(int c = 0; c < Channels; c++)
			{
				float v0 = fx2f(pPoints[i].m_aValues[c]);
				float v1 = fx2f(pPoints[i+1].m_aValues[c]);
				pResult[c] = mix(v0, v1, a);
			}

			return;
		}
	}

	pResult[0] = fx2f(pPoints[NumPoints-1].m_aValues[0]);
	pResult[1] = fx2f(pPoints[NumPoints-1].m_aValues[1]);
	pResult[2] = fx2f(pPoints[NumPoints-1].m_aValues[2]);
	pResult[3] = fx2f(pPoints[NumPoints-1].m_aValues[3]);
	return;
}